

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

void fill_simple_vertices(ALLEGRO_CONFIG *cfg,char *name)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int i;
  float y;
  float x;
  char buf [80];
  char *value;
  uint local_74;
  float local_70;
  float local_6c;
  char local_68 [80];
  long local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(simple_vertices,0,800);
  local_74 = 0;
  while( true ) {
    if (99 < (int)local_74) {
      num_simple_vertices = local_74;
      return;
    }
    sprintf(local_68,"v%d",(ulong)local_74);
    local_18 = al_get_config_value(local_8,local_10,local_68);
    if (local_18 == 0) break;
    iVar1 = __isoc99_sscanf(local_18," %f , %f",&local_6c,&local_70);
    if (iVar1 == 2) {
      simple_vertices[(int)(local_74 << 1)] = local_6c;
      simple_vertices[(int)(local_74 * 2 + 1)] = local_70;
    }
    local_74 = local_74 + 1;
  }
  num_simple_vertices = local_74;
  return;
}

Assistant:

static void fill_simple_vertices(ALLEGRO_CONFIG const *cfg, char const *name)
{
#define MAXBUF    80

   char const *value;
   char buf[MAXBUF];
   float x, y;
   int i;

   memset(simple_vertices, 0, sizeof(simple_vertices));

   for (i = 0; i < MAX_VERTICES; i++) {
      sprintf(buf, "v%d", i);
      value = al_get_config_value(cfg, name, buf);
      if (!value)
         break;

      if (sscanf(value, " %f , %f", &x, &y) == 2) {
         simple_vertices[2*i + 0] = x;
         simple_vertices[2*i + 1] = y;
      }
   }

   num_simple_vertices = i;

#undef MAXBUF
}